

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BoxArray::clear_hash_bin(BoxArray *this)

{
  element_type *peVar1;
  
  peVar1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->hash)._M_h._M_element_count != 0) {
    std::
    _Hashtable<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(peVar1->hash)._M_h);
    ((this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->has_hashmap
         = false;
  }
  return;
}

Assistant:

void
BoxArray::clear_hash_bin () const
{
    if (!m_ref->hash.empty())
    {
#ifdef AMREX_MEM_PROFILING
        m_ref->updateMemoryUsage_hash(-1);
#endif
        m_ref->hash.clear();
        m_ref->has_hashmap = false;
    }
}